

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScopedTransaction.cpp
# Opt level: O3

void __thiscall f8n::db::ScopedTransaction::CommitAndRestart(ScopedTransaction *this)

{
  int iVar1;
  char *sql;
  Connection *this_00;
  
  this_00 = this->connection;
  iVar1 = this_00->transactionCounter + -1;
  this_00->transactionCounter = iVar1;
  if (iVar1 == 0) {
    sql = "COMMIT TRANSACTION";
    if (this->canceled != false) {
      sql = "ROLLBACK TRANSACTION";
    }
    Connection::Execute(this_00,sql);
    this_00 = this->connection;
    iVar1 = this_00->transactionCounter;
  }
  this->canceled = false;
  if (iVar1 == 0) {
    Connection::Execute(this_00,"BEGIN IMMEDIATE TRANSACTION");
    this_00 = this->connection;
    iVar1 = this_00->transactionCounter;
  }
  this_00->transactionCounter = iVar1 + 1;
  return;
}

Assistant:

void ScopedTransaction::CommitAndRestart() {
    this->End();
    this->Begin();
}